

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fillLimited<kj::StringPtr>(char *target,char *limit,StringPtr *first)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  pcVar2 = (first->content).ptr;
  sVar3 = (first->content).size_;
  lVar4 = 0;
  while( true ) {
    pcVar1 = target + lVar4;
    if ((sVar3 - 1 == lVar4) || (pcVar1 == limit)) break;
    *pcVar1 = pcVar2[lVar4];
    lVar4 = lVar4 + 1;
  }
  return pcVar1;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }